

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diagnostic.cpp
# Opt level: O0

void spvtools::UseDiagnosticAsMessageConsumer(spv_context context,spv_diagnostic *diagnostic)

{
  bool bVar1;
  MessageConsumer local_40;
  anon_class_8_1_41352565 local_20;
  anon_class_8_1_41352565 create_diagnostic;
  spv_diagnostic *diagnostic_local;
  spv_context context_local;
  
  bVar1 = false;
  if (diagnostic != (spv_diagnostic *)0x0) {
    bVar1 = *diagnostic == (spv_diagnostic)0x0;
  }
  create_diagnostic.diagnostic = diagnostic;
  if (!bVar1) {
    __assert_fail("diagnostic && *diagnostic == nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/diagnostic.cpp"
                  ,0x76,
                  "void spvtools::UseDiagnosticAsMessageConsumer(spv_context, spv_diagnostic *)");
  }
  local_20.diagnostic = diagnostic;
  std::function<void(spv_message_level_t,char_const*,spv_position_t_const&,char_const*)>::
  function<spvtools::UseDiagnosticAsMessageConsumer(spv_context_t*,spv_diagnostic_t**)::__0,void>
            ((function<void(spv_message_level_t,char_const*,spv_position_t_const&,char_const*)> *)
             &local_40,&local_20);
  SetContextMessageConsumer(context,&local_40);
  std::function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
  ~function(&local_40);
  return;
}

Assistant:

void UseDiagnosticAsMessageConsumer(spv_context context,
                                    spv_diagnostic* diagnostic) {
  assert(diagnostic && *diagnostic == nullptr);

  auto create_diagnostic = [diagnostic](spv_message_level_t, const char*,
                                        const spv_position_t& position,
                                        const char* message) {
    auto p = position;
    spvDiagnosticDestroy(*diagnostic);  // Avoid memory leak.
    *diagnostic = spvDiagnosticCreate(&p, message);
  };
  SetContextMessageConsumer(context, std::move(create_diagnostic));
}